

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
               (int field_number,string *value,CodedOutputStream *output)

{
  Nullable<const_char_*> failure_msg;
  LogMessageFatal local_28;
  unsigned_long local_18;
  
  WriteTag(field_number,WIRETYPE_LENGTH_DELIMITED,output);
  local_28.super_LogMessage._0_8_ = value->_M_string_length;
  local_18 = 0x7fffffff;
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&local_28,&local_18,"value.size() <= kInt32MaxSize");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    io::CodedOutputStream::WriteVarint32(output,(uint32_t)value->_M_string_length);
    io::CodedOutputStream::WriteRawMaybeAliased
              (output,(value->_M_dataplus)._M_p,(int)value->_M_string_length);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_lite.cc"
             ,0x1ce,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

void WireFormatLite::WriteStringMaybeAliased(int field_number,
                                             const std::string& value,
                                             io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  ABSL_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteRawMaybeAliased(value.data(), value.size());
}